

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

UBool __thiscall icu_63::RBBIRuleScanner::doParseActions(RBBIRuleScanner *this,int32_t action)

{
  RBBINode *this_00;
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UnicodeString *pUVar3;
  bool bVar4;
  bool local_4b9;
  RBBINode *local_490;
  UnicodeString local_470;
  ConstChar16Ptr local_430;
  UnicodeString local_428;
  ConstChar16Ptr local_3e8;
  UnicodeString local_3e0;
  ConstChar16Ptr local_3a0;
  UnicodeString local_398;
  ConstChar16Ptr local_358;
  UnicodeString local_350;
  ConstChar16Ptr local_310;
  UnicodeString local_308;
  ConstChar16Ptr local_2c8;
  UnicodeString local_2c0;
  ConstChar16Ptr local_280;
  UnicodeString local_278;
  ConstChar16Ptr local_238;
  UnicodeString local_230;
  ConstChar16Ptr local_1f0;
  UnicodeString local_1e8;
  undefined1 local_1a8 [8];
  UnicodeString opt;
  uint32_t v;
  UnicodeString local_158;
  UnicodeString local_108;
  RBBINode *local_c8;
  RBBINode *starNode;
  RBBINode *operandNode_4;
  RBBINode *qNode;
  RBBINode *operandNode_3;
  RBBINode *plusNode;
  RBBINode *operandNode_2;
  RBBINode *orNode_1;
  RBBINode *prevRules;
  RBBINode **destRules;
  RBBINode *catNode_1;
  RBBINode *endNode;
  RBBINode *thisRule;
  RBBINode *pRStack_60;
  UErrorCode t;
  RBBINode *RHSExprNode;
  RBBINode *varRefNode;
  RBBINode *startExprNode;
  RBBINode *catNode;
  RBBINode *operandNode_1;
  RBBINode *orNode;
  RBBINode *operandNode;
  RBBINode *pRStack_20;
  UBool returnVal;
  RBBINode *n;
  RBBIRuleScanner *pRStack_10;
  int32_t action_local;
  RBBIRuleScanner *this_local;
  
  pRStack_20 = (RBBINode *)0x0;
  operandNode._7_1_ = '\x01';
  n._4_4_ = action;
  pRStack_10 = this;
  switch(action) {
  case 0:
    pRStack_20 = this->fNodeStack[this->fNodeStackPtr];
    bVar4 = pRStack_20->fLeftChild == (RBBINode *)0x0;
    if (bVar4) {
      error(this,U_BRK_UNDEFINED_VARIABLE);
    }
    operandNode._7_1_ = !bVar4;
    break;
  case 1:
    pRStack_20 = pushNewNode(this,setRef);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffea0,L"any");
      UnicodeString::UnicodeString(&local_158,'\x01',(ConstChar16Ptr *)&stack0xfffffffffffffea0,3);
      findSetFor(this,&local_158,pRStack_20,(UnicodeSet *)0x0);
      UnicodeString::~UnicodeString(&local_158);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffea0);
      pRStack_20->fFirstPos = this->fScanIndex;
      pRStack_20->fLastPos = this->fNextIndex;
      pUVar3 = this->fRB->fRules;
      (*(pUVar3->super_Replaceable).super_UObject._vptr_UObject[3])
                (pUVar3,(ulong)(uint)pRStack_20->fFirstPos,(ulong)(uint)pRStack_20->fLastPos,
                 &pRStack_20->fText);
    }
    break;
  case 2:
    fixOpStack(this,precStart);
    varRefNode = this->fNodeStack[this->fNodeStackPtr + -2];
    RHSExprNode = this->fNodeStack[this->fNodeStackPtr + -1];
    pRStack_60 = this->fNodeStack[this->fNodeStackPtr];
    pRStack_60->fFirstPos = varRefNode->fFirstPos;
    pRStack_60->fLastPos = this->fScanIndex;
    pUVar3 = this->fRB->fRules;
    (*(pUVar3->super_Replaceable).super_UObject._vptr_UObject[3])
              (pUVar3,(ulong)(uint)pRStack_60->fFirstPos,(ulong)(uint)pRStack_60->fLastPos,
               &pRStack_60->fText);
    RHSExprNode->fLeftChild = pRStack_60;
    pRStack_60->fParent = RHSExprNode;
    pUVar3 = &RHSExprNode->fText;
    (*(this->fSymbolTable->super_SymbolTable)._vptr_SymbolTable[6])
              (this->fSymbolTable,pUVar3,RHSExprNode,this->fRB->fStatus);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 != '\0') {
      thisRule._4_4_ = *this->fRB->fStatus;
      *this->fRB->fStatus = U_ZERO_ERROR;
      pUVar3 = (UnicodeString *)(ulong)(uint)thisRule._4_4_;
      error(this,thisRule._4_4_);
    }
    this_00 = varRefNode;
    if (varRefNode != (RBBINode *)0x0) {
      RBBINode::~RBBINode(varRefNode);
      UMemory::operator_delete((UMemory *)this_00,pUVar3);
    }
    this->fNodeStackPtr = this->fNodeStackPtr + -3;
    break;
  case 3:
    fixOpStack(this,precStart);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      endNode = this->fNodeStack[this->fNodeStackPtr];
      if (this->fLookAheadRule != '\0') {
        catNode_1 = pushNewNode(this,endMark);
        destRules = (RBBINode **)pushNewNode(this,opCat);
        UVar1 = ::U_FAILURE(*this->fRB->fStatus);
        if (UVar1 != '\0') break;
        this->fNodeStackPtr = this->fNodeStackPtr + -2;
        destRules[2] = endNode;
        destRules[3] = catNode_1;
        this->fNodeStack[this->fNodeStackPtr] = (RBBINode *)destRules;
        catNode_1->fVal = this->fRuleNum;
        catNode_1->fLookAheadEnd = '\x01';
        endNode = (RBBINode *)destRules;
      }
      endNode->fRuleRoot = '\x01';
      if ((this->fRB->fChainRules != '\0') && (this->fNoChainInRule == '\0')) {
        endNode->fChainIn = '\x01';
      }
      if (this->fReverseRule == '\0') {
        local_490 = (RBBINode *)this->fRB->fDefaultTree;
      }
      else {
        local_490 = (RBBINode *)&this->fRB->fSafeRevTree;
      }
      prevRules = local_490;
      if (*(RBBINode **)local_490 == (RBBINode *)0x0) {
        *(RBBINode **)local_490 = this->fNodeStack[this->fNodeStackPtr];
      }
      else {
        endNode = this->fNodeStack[this->fNodeStackPtr];
        orNode_1 = *(RBBINode **)local_490;
        operandNode_2 = pushNewNode(this,opOr);
        UVar1 = ::U_FAILURE(*this->fRB->fStatus);
        if (UVar1 != '\0') break;
        operandNode_2->fLeftChild = orNode_1;
        orNode_1->fParent = operandNode_2;
        operandNode_2->fRightChild = endNode;
        endNode->fParent = operandNode_2;
        *(RBBINode **)prevRules = operandNode_2;
      }
      this->fReverseRule = '\0';
      this->fLookAheadRule = '\0';
      this->fNoChainInRule = '\0';
      this->fNodeStackPtr = 0;
    }
    break;
  case 4:
    pRStack_20 = this->fNodeStack[this->fNodeStackPtr];
    if ((pRStack_20 == (RBBINode *)0x0) || (pRStack_20->fType != varRef)) {
      error(this,U_BRK_ERROR_START);
    }
    else {
      pRStack_20->fLastPos = this->fScanIndex;
      pUVar3 = this->fRB->fRules;
      (*(pUVar3->super_Replaceable).super_UObject._vptr_UObject[3])
                (pUVar3,(ulong)(pRStack_20->fFirstPos + 1),(ulong)(uint)pRStack_20->fLastPos,
                 &pRStack_20->fText);
      iVar2 = (*(this->fSymbolTable->super_SymbolTable)._vptr_SymbolTable[5])
                        (this->fSymbolTable,&pRStack_20->fText);
      pRStack_20->fLeftChild = (RBBINode *)CONCAT44(extraout_var,iVar2);
    }
    break;
  case 5:
    operandNode._7_1_ = '\0';
    break;
  case 6:
    fixOpStack(this,precOpCat);
    iVar2 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar2 + -1;
    catNode = this->fNodeStack[iVar2];
    startExprNode = pushNewNode(this,opCat);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      startExprNode->fLeftChild = catNode;
      catNode->fParent = startExprNode;
    }
    break;
  case 7:
    break;
  case 8:
    fixOpStack(this,precOpCat);
    iVar2 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar2 + -1;
    orNode = this->fNodeStack[iVar2];
    operandNode_1 = pushNewNode(this,opOr);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      operandNode_1->fLeftChild = orNode;
      orNode->fParent = operandNode_1;
    }
    break;
  case 9:
    fixOpStack(this,precLParen);
    break;
  case 10:
    pushNewNode(this,opStart);
    this->fRuleNum = this->fRuleNum + 1;
    break;
  case 0xb:
    pushNewNode(this,opLParen);
    break;
  case 0xc:
    break;
  case 0xd:
    this->fNoChainInRule = '\x01';
    break;
  case 0xe:
    UnicodeString::UnicodeString
              ((UnicodeString *)local_1a8,this->fRB->fRules,this->fOptionStart,
               this->fScanIndex - this->fOptionStart);
    ConstChar16Ptr::ConstChar16Ptr(&local_1f0,L"chain");
    UnicodeString::UnicodeString(&local_1e8,'\x01',&local_1f0,5);
    UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_1e8);
    UnicodeString::~UnicodeString(&local_1e8);
    ConstChar16Ptr::~ConstChar16Ptr(&local_1f0);
    if (UVar1 == '\0') {
      ConstChar16Ptr::ConstChar16Ptr(&local_238,L"LBCMNoChain");
      UnicodeString::UnicodeString(&local_230,'\x01',&local_238,0xb);
      UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_230);
      UnicodeString::~UnicodeString(&local_230);
      ConstChar16Ptr::~ConstChar16Ptr(&local_238);
      if (UVar1 == '\0') {
        ConstChar16Ptr::ConstChar16Ptr(&local_280,L"forward");
        UnicodeString::UnicodeString(&local_278,'\x01',&local_280,7);
        UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_278);
        UnicodeString::~UnicodeString(&local_278);
        ConstChar16Ptr::~ConstChar16Ptr(&local_280);
        if (UVar1 == '\0') {
          ConstChar16Ptr::ConstChar16Ptr(&local_2c8,L"reverse");
          UnicodeString::UnicodeString(&local_2c0,'\x01',&local_2c8,7);
          UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_2c0);
          UnicodeString::~UnicodeString(&local_2c0);
          ConstChar16Ptr::~ConstChar16Ptr(&local_2c8);
          if (UVar1 == '\0') {
            ConstChar16Ptr::ConstChar16Ptr(&local_310,L"safe_forward");
            UnicodeString::UnicodeString(&local_308,'\x01',&local_310,0xc);
            UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_308);
            UnicodeString::~UnicodeString(&local_308);
            ConstChar16Ptr::~ConstChar16Ptr(&local_310);
            if (UVar1 == '\0') {
              ConstChar16Ptr::ConstChar16Ptr(&local_358,L"safe_reverse");
              UnicodeString::UnicodeString(&local_350,'\x01',&local_358,0xc);
              UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_350);
              UnicodeString::~UnicodeString(&local_350);
              ConstChar16Ptr::~ConstChar16Ptr(&local_358);
              if (UVar1 == '\0') {
                ConstChar16Ptr::ConstChar16Ptr(&local_3a0,L"lookAheadHardBreak");
                UnicodeString::UnicodeString(&local_398,'\x01',&local_3a0,0x12);
                UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_398);
                UnicodeString::~UnicodeString(&local_398);
                ConstChar16Ptr::~ConstChar16Ptr(&local_3a0);
                if (UVar1 == '\0') {
                  ConstChar16Ptr::ConstChar16Ptr(&local_3e8,L"quoted_literals_only");
                  UnicodeString::UnicodeString(&local_3e0,'\x01',&local_3e8,0x14);
                  UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_3e0);
                  UnicodeString::~UnicodeString(&local_3e0);
                  ConstChar16Ptr::~ConstChar16Ptr(&local_3e8);
                  if (UVar1 == '\0') {
                    ConstChar16Ptr::ConstChar16Ptr(&local_430,L"unquoted_literals");
                    UnicodeString::UnicodeString(&local_428,'\x01',&local_430,0x11);
                    UVar1 = UnicodeString::operator==((UnicodeString *)local_1a8,&local_428);
                    UnicodeString::~UnicodeString(&local_428);
                    ConstChar16Ptr::~ConstChar16Ptr(&local_430);
                    if (UVar1 == '\0') {
                      error(this,U_BRK_UNRECOGNIZED_OPTION);
                    }
                    else {
                      UnicodeString::UnicodeString
                                (&local_470,L"[^[\\p{Z}\\u0020-\\u007f]-[\\p{L}]-[\\p{N}]]");
                      UnicodeSet::applyPattern
                                ((UnicodeSet *)&this->field_0x588,&local_470,this->fRB->fStatus);
                      UnicodeString::~UnicodeString(&local_470);
                    }
                  }
                  else {
                    UnicodeSet::clear((UnicodeSet *)&this->field_0x588);
                  }
                }
                else {
                  this->fRB->fLookAheadHardBreak = '\x01';
                }
              }
              else {
                this->fRB->fDefaultTree = &this->fRB->fSafeRevTree;
              }
            }
            else {
              this->fRB->fDefaultTree = &this->fRB->fSafeFwdTree;
            }
          }
          else {
            this->fRB->fDefaultTree = &this->fRB->fReverseTree;
          }
        }
        else {
          this->fRB->fDefaultTree = &this->fRB->fForwardTree;
        }
      }
      else {
        this->fRB->fLBCMNoChain = '\x01';
      }
    }
    else {
      this->fRB->fChainRules = '\x01';
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_1a8);
    break;
  case 0xf:
    this->fOptionStart = this->fScanIndex;
    break;
  case 0x10:
    this->fReverseRule = '\x01';
    break;
  case 0x11:
    pRStack_20 = pushNewNode(this,setRef);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      UnicodeString::UnicodeString(&local_108,(this->fC).fChar);
      findSetFor(this,&local_108,pRStack_20,(UnicodeSet *)0x0);
      UnicodeString::~UnicodeString(&local_108);
      pRStack_20->fFirstPos = this->fScanIndex;
      pRStack_20->fLastPos = this->fNextIndex;
      pUVar3 = this->fRB->fRules;
      (*(pUVar3->super_Replaceable).super_UObject._vptr_UObject[3])
                (pUVar3,(ulong)(uint)pRStack_20->fFirstPos,(ulong)(uint)pRStack_20->fLastPos,
                 &pRStack_20->fText);
    }
    break;
  case 0x12:
    error(this,U_BRK_RULE_SYNTAX);
    operandNode._7_1_ = '\0';
    break;
  case 0x13:
    error(this,U_BRK_ASSIGN_ERROR);
    operandNode._7_1_ = '\0';
    break;
  case 0x14:
    scanSet(this);
    break;
  case 0x15:
    pRStack_20 = pushNewNode(this,lookAhead);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      pRStack_20->fVal = this->fRuleNum;
      pRStack_20->fFirstPos = this->fScanIndex;
      pRStack_20->fLastPos = this->fNextIndex;
      pUVar3 = this->fRB->fRules;
      (*(pUVar3->super_Replaceable).super_UObject._vptr_UObject[3])
                (pUVar3,(ulong)(uint)pRStack_20->fFirstPos,(ulong)(uint)pRStack_20->fLastPos,
                 &pRStack_20->fText);
      this->fLookAheadRule = '\x01';
    }
    break;
  case 0x16:
    pRStack_20 = this->fNodeStack[this->fNodeStackPtr + -1];
    pRStack_20->fFirstPos = this->fNextIndex;
    pushNewNode(this,opStart);
    break;
  case 0x17:
    pRStack_20 = pushNewNode(this,tag);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      pRStack_20->fVal = 0;
      pRStack_20->fFirstPos = this->fScanIndex;
      pRStack_20->fLastPos = this->fNextIndex;
    }
    break;
  case 0x18:
    pRStack_20 = pushNewNode(this,varRef);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      pRStack_20->fFirstPos = this->fScanIndex;
    }
    break;
  case 0x19:
    pRStack_20 = this->fNodeStack[this->fNodeStackPtr];
    opt.fUnion._52_4_ = u_charDigitValue_63((this->fC).fChar);
    pRStack_20->fVal = pRStack_20->fVal * 10 + opt.fUnion._52_4_;
    break;
  case 0x1a:
    error(this,U_BRK_MALFORMED_RULE_TAG);
    operandNode._7_1_ = '\0';
    break;
  case 0x1b:
    pRStack_20 = this->fNodeStack[this->fNodeStackPtr];
    pRStack_20->fLastPos = this->fNextIndex;
    pUVar3 = this->fRB->fRules;
    (*(pUVar3->super_Replaceable).super_UObject._vptr_UObject[3])
              (pUVar3,(ulong)(uint)pRStack_20->fFirstPos,(ulong)(uint)pRStack_20->fLastPos,
               &pRStack_20->fText);
    break;
  case 0x1c:
    iVar2 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar2 + -1;
    plusNode = this->fNodeStack[iVar2];
    operandNode_3 = pushNewNode(this,opPlus);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      operandNode_3->fLeftChild = plusNode;
      plusNode->fParent = operandNode_3;
    }
    break;
  case 0x1d:
    iVar2 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar2 + -1;
    qNode = this->fNodeStack[iVar2];
    operandNode_4 = pushNewNode(this,opQuestion);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      operandNode_4->fLeftChild = qNode;
      qNode->fParent = operandNode_4;
    }
    break;
  case 0x1e:
    iVar2 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar2 + -1;
    starNode = this->fNodeStack[iVar2];
    local_c8 = pushNewNode(this,opStar);
    UVar1 = ::U_FAILURE(*this->fRB->fStatus);
    if (UVar1 == '\0') {
      local_c8->fLeftChild = starNode;
      starNode->fParent = local_c8;
    }
    break;
  case 0x1f:
    error(this,U_BRK_RULE_SYNTAX);
    break;
  default:
    error(this,U_BRK_ERROR_START);
    operandNode._7_1_ = '\0';
  }
  local_4b9 = false;
  if (operandNode._7_1_ != '\0') {
    UVar1 = ::U_SUCCESS(*this->fRB->fStatus);
    local_4b9 = UVar1 != '\0';
  }
  return local_4b9;
}

Assistant:

UBool RBBIRuleScanner::doParseActions(int32_t action)
{
    RBBINode *n       = NULL;

    UBool   returnVal = TRUE;

    switch (action) {

    case doExprStart:
        pushNewNode(RBBINode::opStart);
        fRuleNum++;
        break;


    case doNoChain:
        // Scanned a '^' while on the rule start state.
        fNoChainInRule = TRUE;
        break;


    case doExprOrOperator:
        {
            fixOpStack(RBBINode::precOpCat);
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *orNode      = pushNewNode(RBBINode::opOr);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            orNode->fLeftChild     = operandNode;
            operandNode->fParent   = orNode;
        }
        break;

    case doExprCatOperator:
        // concatenation operator.
        // For the implicit concatenation of adjacent terms in an expression that are
        //   not separated by any other operator.  Action is invoked between the
        //   actions for the two terms.
        {
            fixOpStack(RBBINode::precOpCat);
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *catNode     = pushNewNode(RBBINode::opCat);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            catNode->fLeftChild    = operandNode;
            operandNode->fParent   = catNode;
        }
        break;

    case doLParen:
        // Open Paren.
        //   The openParen node is a dummy operation type with a low precedence,
        //     which has the affect of ensuring that any real binary op that
        //     follows within the parens binds more tightly to the operands than
        //     stuff outside of the parens.
        pushNewNode(RBBINode::opLParen);
        break;

    case doExprRParen:
        fixOpStack(RBBINode::precLParen);
        break;

    case doNOP:
        break;

    case doStartAssign:
        // We've just scanned "$variable = "
        // The top of the node stack has the $variable ref node.

        // Save the start position of the RHS text in the StartExpression node
        //   that precedes the $variableReference node on the stack.
        //   This will eventually be used when saving the full $variable replacement
        //   text as a string.
        n = fNodeStack[fNodeStackPtr-1];
        n->fFirstPos = fNextIndex;              // move past the '='

        // Push a new start-of-expression node; needed to keep parse of the
        //   RHS expression happy.
        pushNewNode(RBBINode::opStart);
        break;




    case doEndAssign:
        {
            // We have reached the end of an assignement statement.
            //   Current scan char is the ';' that terminates the assignment.

            // Terminate expression, leaves expression parse tree rooted in TOS node.
            fixOpStack(RBBINode::precStart);

            RBBINode *startExprNode  = fNodeStack[fNodeStackPtr-2];
            RBBINode *varRefNode     = fNodeStack[fNodeStackPtr-1];
            RBBINode *RHSExprNode    = fNodeStack[fNodeStackPtr];

            // Save original text of right side of assignment, excluding the terminating ';'
            //  in the root of the node for the right-hand-side expression.
            RHSExprNode->fFirstPos = startExprNode->fFirstPos;
            RHSExprNode->fLastPos  = fScanIndex;
            fRB->fRules.extractBetween(RHSExprNode->fFirstPos, RHSExprNode->fLastPos, RHSExprNode->fText);

            // Expression parse tree becomes l. child of the $variable reference node.
            varRefNode->fLeftChild = RHSExprNode;
            RHSExprNode->fParent   = varRefNode;

            // Make a symbol table entry for the $variableRef node.
            fSymbolTable->addEntry(varRefNode->fText, varRefNode, *fRB->fStatus);
            if (U_FAILURE(*fRB->fStatus)) {
                // This is a round-about way to get the parse position set
                //  so that duplicate symbols error messages include a line number.
                UErrorCode t = *fRB->fStatus;
                *fRB->fStatus = U_ZERO_ERROR;
                error(t);
            }

            // Clean up the stack.
            delete startExprNode;
            fNodeStackPtr-=3;
            break;
        }

    case doEndOfRule:
        {
        fixOpStack(RBBINode::precStart);      // Terminate expression, leaves expression
        if (U_FAILURE(*fRB->fStatus)) {       //   parse tree rooted in TOS node.
            break;
        }
#ifdef RBBI_DEBUG
        if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "rtree")) {printNodeStack("end of rule");}
#endif
        U_ASSERT(fNodeStackPtr == 1);
        RBBINode *thisRule = fNodeStack[fNodeStackPtr];

        // If this rule includes a look-ahead '/', add a endMark node to the
        //   expression tree.
        if (fLookAheadRule) {
            RBBINode  *endNode        = pushNewNode(RBBINode::endMark);
            RBBINode  *catNode        = pushNewNode(RBBINode::opCat);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            fNodeStackPtr -= 2;
            catNode->fLeftChild       = thisRule;
            catNode->fRightChild      = endNode;
            fNodeStack[fNodeStackPtr] = catNode;
            endNode->fVal             = fRuleNum;
            endNode->fLookAheadEnd    = TRUE;
            thisRule                  = catNode;

            // TODO: Disable chaining out of look-ahead (hard break) rules.
            //   The break on rule match is forced, so there is no point in building up
            //   the state table to chain into another rule for a longer match.
        }

        // Mark this node as being the root of a rule.
        thisRule->fRuleRoot = TRUE;

        // Flag if chaining into this rule is wanted.
        //    
        if (fRB->fChainRules &&         // If rule chaining is enabled globally via !!chain
                !fNoChainInRule) {      //     and no '^' chain-in inhibit was on this rule
            thisRule->fChainIn = TRUE;
        }


        // All rule expressions are ORed together.
        // The ';' that terminates an expression really just functions as a '|' with
        //   a low operator prededence.
        //
        // Each of the four sets of rules are collected separately.
        //  (forward, reverse, safe_forward, safe_reverse)
        //  OR this rule into the appropriate group of them.
        //
        RBBINode **destRules = (fReverseRule? &fRB->fSafeRevTree : fRB->fDefaultTree);

        if (*destRules != NULL) {
            // This is not the first rule encounted.
            // OR previous stuff  (from *destRules)
            // with the current rule expression (on the Node Stack)
            //  with the resulting OR expression going to *destRules
            //
                       thisRule    = fNodeStack[fNodeStackPtr];
            RBBINode  *prevRules   = *destRules;
            RBBINode  *orNode      = pushNewNode(RBBINode::opOr);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            orNode->fLeftChild     = prevRules;
            prevRules->fParent     = orNode;
            orNode->fRightChild    = thisRule;
            thisRule->fParent      = orNode;
            *destRules             = orNode;
        }
        else
        {
            // This is the first rule encountered (for this direction).
            // Just move its parse tree from the stack to *destRules.
            *destRules = fNodeStack[fNodeStackPtr];
        }
        fReverseRule   = FALSE;   // in preparation for the next rule.
        fLookAheadRule = FALSE;
        fNoChainInRule = FALSE;
        fNodeStackPtr  = 0;
        }
        break;


    case doRuleError:
        error(U_BRK_RULE_SYNTAX);
        returnVal = FALSE;
        break;


    case doVariableNameExpectedErr:
        error(U_BRK_RULE_SYNTAX);
        break;


    //
    //  Unary operands  + ? *
    //    These all appear after the operand to which they apply.
    //    When we hit one, the operand (may be a whole sub expression)
    //    will be on the top of the stack.
    //    Unary Operator becomes TOS, with the old TOS as its one child.
    case doUnaryOpPlus:
        {
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *plusNode    = pushNewNode(RBBINode::opPlus);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            plusNode->fLeftChild   = operandNode;
            operandNode->fParent   = plusNode;
        }
        break;

    case doUnaryOpQuestion:
        {
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *qNode       = pushNewNode(RBBINode::opQuestion);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            qNode->fLeftChild      = operandNode;
            operandNode->fParent   = qNode;
        }
        break;

    case doUnaryOpStar:
        {
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *starNode    = pushNewNode(RBBINode::opStar);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            starNode->fLeftChild   = operandNode;
            operandNode->fParent   = starNode;
        }
        break;

    case doRuleChar:
        // A "Rule Character" is any single character that is a literal part
        // of the regular expression.  Like a, b and c in the expression "(abc*) | [:L:]"
        // These are pretty uncommon in break rules; the terms are more commonly
        //  sets.  To keep things uniform, treat these characters like as
        // sets that just happen to contain only one character.
        {
            n = pushNewNode(RBBINode::setRef);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            findSetFor(UnicodeString(fC.fChar), n);
            n->fFirstPos = fScanIndex;
            n->fLastPos  = fNextIndex;
            fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
            break;
        }

    case doDotAny:
        // scanned a ".", meaning match any single character.
        {
            n = pushNewNode(RBBINode::setRef);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            findSetFor(UnicodeString(TRUE, kAny, 3), n);
            n->fFirstPos = fScanIndex;
            n->fLastPos  = fNextIndex;
            fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
            break;
        }

    case doSlash:
        // Scanned a '/', which identifies a look-ahead break position in a rule.
        n = pushNewNode(RBBINode::lookAhead);
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }
        n->fVal      = fRuleNum;
        n->fFirstPos = fScanIndex;
        n->fLastPos  = fNextIndex;
        fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
        fLookAheadRule = TRUE;
        break;


    case doStartTagValue:
        // Scanned a '{', the opening delimiter for a tag value within a rule.
        n = pushNewNode(RBBINode::tag);
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }
        n->fVal      = 0;
        n->fFirstPos = fScanIndex;
        n->fLastPos  = fNextIndex;
        break;

    case doTagDigit:
        // Just scanned a decimal digit that's part of a tag value
        {
            n = fNodeStack[fNodeStackPtr];
            uint32_t v = u_charDigitValue(fC.fChar);
            U_ASSERT(v < 10);
            n->fVal = n->fVal*10 + v;
            break;
        }

    case doTagValue:
        n = fNodeStack[fNodeStackPtr];
        n->fLastPos = fNextIndex;
        fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
        break;

    case doTagExpectedError:
        error(U_BRK_MALFORMED_RULE_TAG);
        returnVal = FALSE;
        break;

    case doOptionStart:
        // Scanning a !!option.   At the start of string.
        fOptionStart = fScanIndex;
        break;

    case doOptionEnd:
        {
            UnicodeString opt(fRB->fRules, fOptionStart, fScanIndex-fOptionStart);
            if (opt == UNICODE_STRING("chain", 5)) {
                fRB->fChainRules = TRUE;
            } else if (opt == UNICODE_STRING("LBCMNoChain", 11)) {
                fRB->fLBCMNoChain = TRUE;
            } else if (opt == UNICODE_STRING("forward", 7)) {
                fRB->fDefaultTree   = &fRB->fForwardTree;
            } else if (opt == UNICODE_STRING("reverse", 7)) {
                fRB->fDefaultTree   = &fRB->fReverseTree;
            } else if (opt == UNICODE_STRING("safe_forward", 12)) {
                fRB->fDefaultTree   = &fRB->fSafeFwdTree;
            } else if (opt == UNICODE_STRING("safe_reverse", 12)) {
                fRB->fDefaultTree   = &fRB->fSafeRevTree;
            } else if (opt == UNICODE_STRING("lookAheadHardBreak", 18)) {
                fRB->fLookAheadHardBreak = TRUE;
            } else if (opt == UNICODE_STRING("quoted_literals_only", 20)) {
                fRuleSets[kRuleSet_rule_char-128].clear();
            } else if (opt == UNICODE_STRING("unquoted_literals",  17)) {
                fRuleSets[kRuleSet_rule_char-128].applyPattern(UnicodeString(gRuleSet_rule_char_pattern), *fRB->fStatus);
            } else {
                error(U_BRK_UNRECOGNIZED_OPTION);
            }
        }
        break;

    case doReverseDir:
        fReverseRule = TRUE;
        break;

    case doStartVariableName:
        n = pushNewNode(RBBINode::varRef);
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }
        n->fFirstPos = fScanIndex;
        break;

    case doEndVariableName:
        n = fNodeStack[fNodeStackPtr];
        if (n==NULL || n->fType != RBBINode::varRef) {
            error(U_BRK_INTERNAL_ERROR);
            break;
        }
        n->fLastPos = fScanIndex;
        fRB->fRules.extractBetween(n->fFirstPos+1, n->fLastPos, n->fText);
        // Look the newly scanned name up in the symbol table
        //   If there's an entry, set the l. child of the var ref to the replacement expression.
        //   (We also pass through here when scanning assignments, but no harm is done, other
        //    than a slight wasted effort that seems hard to avoid.  Lookup will be null)
        n->fLeftChild = fSymbolTable->lookupNode(n->fText);
        break;

    case doCheckVarDef:
        n = fNodeStack[fNodeStackPtr];
        if (n->fLeftChild == NULL) {
            error(U_BRK_UNDEFINED_VARIABLE);
            returnVal = FALSE;
        }
        break;

    case doExprFinished:
        break;

    case doRuleErrorAssignExpr:
        error(U_BRK_ASSIGN_ERROR);
        returnVal = FALSE;
        break;

    case doExit:
        returnVal = FALSE;
        break;

    case doScanUnicodeSet:
        scanSet();
        break;

    default:
        error(U_BRK_INTERNAL_ERROR);
        returnVal = FALSE;
        break;
    }
    return returnVal && U_SUCCESS(*fRB->fStatus);
}